

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

bool out_CreateAssert(AssertionType type,Expression *expr,char *message,uint32_t ofs)

{
  Assertion *__ptr;
  Patch *pPVar1;
  char *pcVar2;
  
  __ptr = (Assertion *)malloc(0x20);
  if (__ptr != (Assertion *)0x0) {
    pPVar1 = allocpatch(type,expr,ofs);
    __ptr->patch = pPVar1;
    pcVar2 = strdup(message);
    __ptr->message = pcVar2;
    if (pcVar2 != (char *)0x0) {
      __ptr->next = assertions;
      assertions = __ptr;
      return true;
    }
    free(__ptr);
  }
  return false;
}

Assistant:

bool out_CreateAssert(enum AssertionType type, struct Expression const *expr,
		      char const *message, uint32_t ofs)
{
	struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

	if (!assertion)
		return false;

	assertion->patch = allocpatch(type, expr, ofs);
	assertion->message = strdup(message);
	if (!assertion->message) {
		free(assertion);
		return false;
	}

	assertion->next = assertions;
	assertions = assertion;

	return true;
}